

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

bool __thiscall
cmOutputRequiredFilesCommand::InitialPass
          (cmOutputRequiredFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  cmDependInformation *info;
  FILE *__stream;
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  visited;
  cmLBDepend md;
  allocator local_289;
  undefined1 local_288 [32];
  _Base_ptr local_268;
  size_t local_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [34];
  
  bVar2 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0032,
                     "The output_required_files command should not be called; see CMP0032.");
  if (bVar2) {
    return true;
  }
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_258);
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,local_248[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  std::__cxx11::string::_M_assign((string *)&this->File);
  std::__cxx11::string::_M_assign((string *)&this->OutputFile);
  cmMakeDepend::cmMakeDepend((cmMakeDepend *)local_258);
  local_258._0_8_ = &PTR__cmMakeDepend_006c0a88;
  cmMakeDepend::SetMakefile((cmMakeDepend *)local_258,(this->super_cmCommand).Makefile);
  pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)local_288,pcVar3,&local_289);
  cmMakeDepend::AddSearchPath((cmMakeDepend *)local_258,(string *)local_288);
  pcVar1 = local_288 + 0x10;
  if ((pointer)local_288._0_8_ != pcVar1) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  info = cmMakeDepend::FindDependencies((cmMakeDepend *)local_258,(this->File)._M_dataplus._M_p);
  if (info != (cmDependInformation *)0x0) {
    std::__cxx11::string::string((string *)local_288,(this->OutputFile)._M_dataplus._M_p,&local_289)
    ;
    __stream = (FILE *)cmsys::SystemTools::Fopen((string *)local_288,"w");
    if ((pointer)local_288._0_8_ != pcVar1) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    if (__stream == (FILE *)0x0) {
      local_288._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_288,"Can not open output file: ","");
      std::__cxx11::string::_M_append(local_288,(ulong)(this->OutputFile)._M_dataplus._M_p);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_288);
      if ((pointer)local_288._0_8_ != pcVar1) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
      }
    }
    else {
      local_288._24_8_ = local_288 + 8;
      local_288._8_4_ = _S_red;
      local_288._16_8_ = 0;
      local_260 = 0;
      local_268 = (_Base_ptr)local_288._24_8_;
      ListDependencies(this,info,(FILE *)__stream,
                       (set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                        *)local_288);
      fclose(__stream);
      std::
      _Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                   *)local_288);
    }
    if (__stream == (FILE *)0x0) {
      bVar2 = false;
      goto LAB_0040cbbe;
    }
  }
  bVar2 = true;
LAB_0040cbbe:
  cmMakeDepend::~cmMakeDepend((cmMakeDepend *)local_258);
  return bVar2;
}

Assistant:

bool cmOutputRequiredFilesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0032,
      "The output_required_files command should not be called; see CMP0032."))
    { return true; }
  if(args.size() != 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // store the arg for final pass
  this->File = args[0];
  this->OutputFile = args[1];

  // compute the list of files
  cmLBDepend md;
  md.SetMakefile(this->Makefile);
  md.AddSearchPath(this->Makefile->GetCurrentSourceDirectory());
  // find the depends for a file
  const cmDependInformation *info = md.FindDependencies(this->File.c_str());
  if (info)
    {
    // write them out
    FILE *fout = cmsys::SystemTools::Fopen(this->OutputFile.c_str(),"w");
    if(!fout)
      {
      std::string err = "Can not open output file: ";
      err += this->OutputFile;
      this->SetError(err);
      return false;
      }
    std::set<cmDependInformation const*> visited;
    this->ListDependencies(info,fout, &visited);
    fclose(fout);
    }

  return true;
}